

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O1

ValueLimits
google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum(EnumDescriptor *descriptor)

{
  Nonnull<const_char_*> pcVar1;
  long lVar2;
  EnumValueDescriptor *pEVar3;
  EnumValueDescriptor *pEVar4;
  long v1;
  ValueLimits VVar5;
  
  if ((long)descriptor->value_count_ < 1) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)descriptor->value_count_,"index < value_count()");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    pEVar4 = descriptor->values_;
    if ((long)descriptor->value_count_ < 1) {
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)descriptor->value_count_,"index < value_count()");
    }
    else {
      pcVar1 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar1 == (Nonnull<const_char_*>)0x0) {
      pEVar3 = descriptor->values_;
      if (1 < descriptor->value_count_) {
        v1 = 1;
        lVar2 = 0x30;
        do {
          if (*(int *)((long)&descriptor->values_->number_ + lVar2) < pEVar4->number_) {
            if (v1 < descriptor->value_count_) {
              pcVar1 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)descriptor->value_count_,"index < value_count()");
            }
            if (pcVar1 == (Nonnull<const_char_*>)0x0) {
              pEVar4 = (EnumValueDescriptor *)(&descriptor->values_->super_SymbolBaseN<0> + lVar2);
              goto LAB_002f19f6;
            }
LAB_002f1ac1:
            FromEnum();
            goto LAB_002f1ace;
          }
LAB_002f19f6:
          if (v1 < descriptor->value_count_) {
            pcVar1 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (v1,(long)descriptor->value_count_,"index < value_count()");
          }
          if (pcVar1 != (Nonnull<const_char_*>)0x0) {
            FromEnum();
LAB_002f1ab4:
            FromEnum();
            goto LAB_002f1ac1;
          }
          if (pEVar3->number_ < *(int *)((long)&descriptor->values_->number_ + lVar2)) {
            if (v1 < descriptor->value_count_) {
              pcVar1 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                 (v1,(long)descriptor->value_count_,"index < value_count()");
            }
            if (pcVar1 != (Nonnull<const_char_*>)0x0) goto LAB_002f1ab4;
            pEVar3 = (EnumValueDescriptor *)(&descriptor->values_->super_SymbolBaseN<0> + lVar2);
          }
          v1 = v1 + 1;
          lVar2 = lVar2 + 0x30;
        } while (v1 < descriptor->value_count_);
      }
      VVar5.max = pEVar3;
      VVar5.min = pEVar4;
      return VVar5;
    }
  }
  else {
LAB_002f1ace:
    FromEnum();
  }
  FromEnum();
}

Assistant:

EnumGenerator::ValueLimits EnumGenerator::ValueLimits::FromEnum(
    const EnumDescriptor* descriptor) {
  const EnumValueDescriptor* min_desc = descriptor->value(0);
  const EnumValueDescriptor* max_desc = descriptor->value(0);

  for (int i = 1; i < descriptor->value_count(); ++i) {
    if (descriptor->value(i)->number() < min_desc->number()) {
      min_desc = descriptor->value(i);
    }
    if (descriptor->value(i)->number() > max_desc->number()) {
      max_desc = descriptor->value(i);
    }
  }

  return EnumGenerator::ValueLimits{min_desc, max_desc};
}